

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

CAmount wallet::CachedTxGetCredit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  bool bVar1;
  CAmount CVar2;
  long in_FS_OFFSET;
  isminefilter get_amount_filter;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CWallet::IsTxImmatureCoinBase(wallet,wtx);
  if ((bVar1) || (local_24 = *filter & 3, local_24 == 0)) {
    CVar2 = 0;
  }
  else {
    CVar2 = GetCachableAmount(wallet,wtx,CREDIT,&local_24);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

CAmount CachedTxGetCredit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    AssertLockHeld(wallet.cs_wallet);

    // Must wait until coinbase is safely deep enough in the chain before valuing it
    if (wallet.IsTxImmatureCoinBase(wtx))
        return 0;

    CAmount credit = 0;
    const isminefilter get_amount_filter{filter & ISMINE_ALL};
    if (get_amount_filter) {
        // GetBalance can assume transactions in mapWallet won't change
        credit += GetCachableAmount(wallet, wtx, CWalletTx::CREDIT, get_amount_filter);
    }
    return credit;
}